

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v5_16.c
# Opt level: O0

int can_calc_bittiming_v5_16(net_device *dev,can_bittiming *bt,can_bittiming_const *btc)

{
  uint uVar1;
  can_bittiming_const *in_RDX;
  uint *in_RSI;
  net_device *in_RDI;
  uint32_t __rem_1;
  uint32_t __base_1;
  uint32_t __rem;
  uint32_t __base;
  int __x;
  u64 v64;
  uint tseg2;
  uint tseg1;
  uint tseg;
  uint tsegall;
  uint brp;
  uint best_brp;
  uint best_tseg;
  uint sample_point_nominal;
  uint best_sample_point_error;
  uint sample_point_error;
  uint best_bitrate_error;
  uint bitrate_error;
  uint bitrate;
  can_priv *priv;
  uint local_8c;
  uint local_5c;
  uint local_58;
  uint local_54;
  int local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint *local_28;
  can_bittiming_const *local_20;
  uint *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_28 = (uint *)netdev_priv(in_RDI);
  local_34 = 0xffffffff;
  local_3c = 0xffffffff;
  local_44 = 0;
  local_48 = 0;
  local_58 = 0;
  local_5c = 0;
  if (local_18[1] == 0) {
    if (*local_18 < 0xc3501) {
      if (*local_18 < 0x7a121) {
        local_40 = 0x36b;
      }
      else {
        local_40 = 800;
      }
    }
    else {
      local_40 = 0x2ee;
    }
  }
  else {
    local_40 = local_18[1];
  }
  for (local_54 = (local_20->tseg1_max + local_20->tseg2_max) * 2 + 1;
      (local_20->tseg1_min + local_20->tseg2_min) * 2 <= local_54; local_54 = local_54 - 1) {
    local_50 = (local_54 >> 1) + 1;
    local_4c = ((*local_28 / (local_50 * *local_18) + (local_54 & 1)) / local_20->brp_inc) *
               local_20->brp_inc;
    if ((local_20->brp_min <= local_4c) && (local_4c <= local_20->brp_max)) {
      local_2c = *local_28 / (local_4c * local_50);
      local_8c = *local_18 - local_2c;
      if ((int)local_8c < 0) {
        local_8c = -local_8c;
      }
      local_30 = local_8c;
      if (local_8c <= local_34) {
        if (local_8c < local_34) {
          local_3c = 0xffffffff;
        }
        can_update_sample_point_v5_16(local_20,local_40,local_54 >> 1,&local_58,&local_5c,&local_38)
        ;
        if (local_38 <= local_3c) {
          local_3c = local_38;
          local_34 = local_30;
          local_44 = local_54 >> 1;
          local_48 = local_4c;
          if ((local_30 == 0) && (local_38 == 0)) break;
        }
      }
    }
  }
  if ((local_34 == 0) ||
     (local_30 = (uint)(((ulong)local_34 * 1000) / (ulong)*local_18), local_30 < 0x33)) {
    uVar1 = can_update_sample_point_v5_16
                      (local_20,local_40,local_44,&local_58,&local_5c,(uint *)0x0);
    local_18[1] = uVar1;
    local_18[2] = (uint)(((ulong)local_48 * 1000000000) / (ulong)*local_28);
    local_18[3] = local_58 >> 1;
    local_18[4] = local_58 - local_18[3];
    local_18[5] = local_5c;
    if ((local_18[6] == 0) || (local_20->sjw_max == 0)) {
      local_18[6] = 1;
    }
    else {
      if (local_20->sjw_max < local_18[6]) {
        local_18[6] = local_20->sjw_max;
      }
      if (local_5c < local_18[6]) {
        local_18[6] = local_5c;
      }
    }
    local_18[7] = local_48;
    *local_18 = *local_28 / (local_18[7] * (local_58 + 1 + local_5c));
    local_4 = 0;
  }
  else {
    local_4 = -0x21;
  }
  return local_4;
}

Assistant:

int can_calc_bittiming(struct net_device *dev, struct can_bittiming *bt,
		       const struct can_bittiming_const *btc)
{
	struct can_priv *priv = netdev_priv(dev);
	unsigned int bitrate;			/* current bitrate */
	unsigned int bitrate_error;		/* difference between current and nominal value */
	unsigned int best_bitrate_error = UINT_MAX;
	unsigned int sample_point_error;	/* difference between current and nominal value */
	unsigned int best_sample_point_error = UINT_MAX;
	unsigned int sample_point_nominal;	/* nominal sample point */
	unsigned int best_tseg = 0;		/* current best value for tseg */
	unsigned int best_brp = 0;		/* current best value for brp */
	unsigned int brp, tsegall, tseg, tseg1 = 0, tseg2 = 0;
	u64 v64;

	/* Use CiA recommended sample points */
	if (bt->sample_point) {
		sample_point_nominal = bt->sample_point;
	} else {
		if (bt->bitrate > 800 * CAN_KBPS)
			sample_point_nominal = 750;
		else if (bt->bitrate > 500 * CAN_KBPS)
			sample_point_nominal = 800;
		else
			sample_point_nominal = 875;
	}

	/* tseg even = round down, odd = round up */
	for (tseg = (btc->tseg1_max + btc->tseg2_max) * 2 + 1;
	     tseg >= (btc->tseg1_min + btc->tseg2_min) * 2; tseg--) {
		tsegall = CAN_SYNC_SEG + tseg / 2;

		/* Compute all possible tseg choices (tseg=tseg1+tseg2) */
		brp = priv->clock.freq / (tsegall * bt->bitrate) + tseg % 2;

		/* choose brp step which is possible in system */
		brp = (brp / btc->brp_inc) * btc->brp_inc;
		if (brp < btc->brp_min || brp > btc->brp_max)
			continue;

		bitrate = priv->clock.freq / (brp * tsegall);
		bitrate_error = abs(bt->bitrate - bitrate);

		/* tseg brp biterror */
		if (bitrate_error > best_bitrate_error)
			continue;

		/* reset sample point error if we have a better bitrate */
		if (bitrate_error < best_bitrate_error)
			best_sample_point_error = UINT_MAX;

		can_update_sample_point(btc, sample_point_nominal, tseg / 2,
					&tseg1, &tseg2, &sample_point_error);
		if (sample_point_error > best_sample_point_error)
			continue;

		best_sample_point_error = sample_point_error;
		best_bitrate_error = bitrate_error;
		best_tseg = tseg / 2;
		best_brp = brp;

		if (bitrate_error == 0 && sample_point_error == 0)
			break;
	}

	if (best_bitrate_error) {
		/* Error in one-tenth of a percent */
		v64 = (u64)best_bitrate_error * 1000;
		do_div(v64, bt->bitrate);
		bitrate_error = (u32)v64;
		if (bitrate_error > CAN_CALC_MAX_ERROR) {
			netdev_err(dev,
				   "bitrate error %d.%d%% too high\n",
				   bitrate_error / 10, bitrate_error % 10);
			return -EDOM;
		}
		netdev_warn(dev, "bitrate error %d.%d%%\n",
			    bitrate_error / 10, bitrate_error % 10);
	}

	/* real sample point */
	bt->sample_point = can_update_sample_point(btc, sample_point_nominal,
						   best_tseg, &tseg1, &tseg2,
						   NULL);

	v64 = (u64)best_brp * 1000 * 1000 * 1000;
	do_div(v64, priv->clock.freq);
	bt->tq = (u32)v64;
	bt->prop_seg = tseg1 / 2;
	bt->phase_seg1 = tseg1 - bt->prop_seg;
	bt->phase_seg2 = tseg2;

	/* check for sjw user settings */
	if (!bt->sjw || !btc->sjw_max) {
		bt->sjw = 1;
	} else {
		/* bt->sjw is at least 1 -> sanitize upper bound to sjw_max */
		if (bt->sjw > btc->sjw_max)
			bt->sjw = btc->sjw_max;
		/* bt->sjw must not be higher than tseg2 */
		if (tseg2 < bt->sjw)
			bt->sjw = tseg2;
	}

	bt->brp = best_brp;

	/* real bitrate */
	bt->bitrate = priv->clock.freq /
		(bt->brp * (CAN_SYNC_SEG + tseg1 + tseg2));

	return 0;
}